

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong uVar1;
  Geometry *this;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  byte bVar13;
  size_t i;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar25;
  float fVar26;
  undefined1 auVar22 [16];
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar28;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1058 [4];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  long local_1030;
  long local_1028;
  ulong local_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [8];
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar47 = (query->p).field_0.field_0.x;
  fVar51 = (query->p).field_0.field_0.y;
  fVar55 = (query->p).field_0.field_0.z;
  fVar62 = (context->query_radius).field_0.m128[0];
  fVar59 = (context->query_radius).field_0.m128[1];
  fVar60 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fVar43 = query->radius * query->radius;
    fStack_1040 = 0.0;
    fStack_1044 = 0.0;
  }
  else {
    fVar43 = (context->query_radius).field_0.m128[0];
    fVar48 = (context->query_radius).field_0.m128[1];
    fStack_1040 = (context->query_radius).field_0.m128[2];
    fStack_1044 = (context->query_radius).field_0.m128[3];
    fStack_1040 = fStack_1040 * fStack_1040;
    fStack_1044 = fStack_1044 * fStack_1044;
    fVar43 = fStack_1040 + fVar48 * fVar48 + fVar43 * fVar43;
  }
  pauVar9 = (undefined1 (*) [16])local_f68;
  bVar6 = false;
  local_f98 = fVar47;
  fStack_f94 = fVar47;
  fStack_f90 = fVar47;
  fStack_f8c = fVar47;
  local_fa8 = fVar51;
  fStack_fa4 = fVar51;
  fStack_fa0 = fVar51;
  fStack_f9c = fVar51;
  local_fb8 = fVar55;
  fStack_fb4 = fVar55;
  fStack_fb0 = fVar55;
  fStack_fac = fVar55;
  fVar48 = fVar47;
  fVar49 = fVar47;
  fVar50 = fVar47;
  fVar52 = fVar51;
  fVar53 = fVar51;
  fVar54 = fVar51;
  fVar56 = fVar55;
  fVar57 = fVar55;
  fVar58 = fVar55;
  do {
    local_fe8 = fVar47 - fVar62;
    fStack_fe4 = fVar48 - fVar62;
    fStack_fe0 = fVar49 - fVar62;
    fStack_fdc = fVar50 - fVar62;
    local_ff8 = fVar47 + fVar62;
    fStack_ff4 = fVar48 + fVar62;
    fStack_ff0 = fVar49 + fVar62;
    fStack_fec = fVar50 + fVar62;
    local_1008 = fVar51 - fVar59;
    fStack_1004 = fVar52 - fVar59;
    fStack_1000 = fVar53 - fVar59;
    fStack_ffc = fVar54 - fVar59;
    local_fc8._0_4_ = fVar59 + fVar51;
    local_fc8._4_4_ = fVar59 + fVar52;
    fStack_fc0 = fVar59 + fVar53;
    fStack_fbc = fVar59 + fVar54;
    local_1018 = fVar55 - fVar60;
    fStack_1014 = fVar56 - fVar60;
    fStack_1010 = fVar57 - fVar60;
    fStack_100c = fVar58 - fVar60;
    local_fd8._0_4_ = fVar60 + fVar55;
    local_fd8._4_4_ = fVar60 + fVar56;
    fStack_fd0 = fVar60 + fVar57;
    fStack_fcc = fVar60 + fVar58;
    fVar59 = fVar62 * fVar62;
    fVar60 = fVar62 * fVar62;
    fVar61 = fVar62 * fVar62;
    fVar62 = fVar62 * fVar62;
    local_1048 = fVar43;
    fStack_103c = fStack_1044;
    local_f88 = fVar59;
    fStack_f84 = fVar60;
    fStack_f80 = fVar61;
    fStack_f7c = fVar62;
LAB_0056da8e:
    do {
      do {
        if (pauVar9 == (undefined1 (*) [16])&local_f78) {
          return bVar6;
        }
        pauVar8 = pauVar9 + -1;
        pauVar9 = pauVar9 + -1;
      } while (fVar43 < *(float *)((long)*pauVar8 + 8));
      pauVar8 = (undefined1 (*) [16])&local_f78;
      pauVar10 = *(undefined1 (**) [16])*pauVar9;
LAB_0056dab3:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if (((ulong)pauVar10 & 8) != 0) goto LAB_0056de6b;
        auVar15 = pauVar10[6];
        auVar19 = pauVar10[2];
        auVar22 = pauVar10[3];
        auVar37 = pauVar10[4];
        auVar42 = pauVar10[5];
        auVar18 = pauVar10[7];
        auVar44._4_4_ = fVar48;
        auVar44._0_4_ = fVar47;
        auVar44._8_4_ = fVar49;
        auVar44._12_4_ = fVar50;
        auVar44 = maxps(auVar44,auVar19);
        auVar44 = minps(auVar44,auVar22);
        fVar43 = auVar44._0_4_ - fVar47;
        fVar25 = auVar44._4_4_ - fVar48;
        fVar27 = auVar44._8_4_ - fVar49;
        fVar32 = auVar44._12_4_ - fVar50;
        auVar46._4_4_ = fVar52;
        auVar46._0_4_ = fVar51;
        auVar46._8_4_ = fVar53;
        auVar46._12_4_ = fVar54;
        auVar44 = maxps(auVar46,auVar37);
        auVar44 = minps(auVar44,auVar42);
        fVar34 = auVar44._0_4_ - fVar51;
        fVar35 = auVar44._4_4_ - fVar52;
        fVar38 = auVar44._8_4_ - fVar53;
        fVar39 = auVar44._12_4_ - fVar54;
        auVar45._4_4_ = fVar56;
        auVar45._0_4_ = fVar55;
        auVar45._8_4_ = fVar57;
        auVar45._12_4_ = fVar58;
        auVar44 = maxps(auVar45,auVar15);
        auVar44 = minps(auVar44,auVar18);
        fVar21 = auVar44._0_4_ - fVar55;
        fVar26 = auVar44._4_4_ - fVar56;
        fVar28 = auVar44._8_4_ - fVar57;
        fVar33 = auVar44._12_4_ - fVar58;
        local_1058[0] = fVar21 * fVar21 + fVar34 * fVar34 + fVar43 * fVar43;
        local_1058[1] = fVar26 * fVar26 + fVar35 * fVar35 + fVar25 * fVar25;
        local_1058[2] = fVar28 * fVar28 + fVar38 * fVar38 + fVar27 * fVar27;
        local_1058[3] = fVar33 * fVar33 + fVar39 * fVar39 + fVar32 * fVar32;
        bVar3 = ((auVar15._0_4_ <= (float)local_fd8._0_4_ && local_fe8 <= auVar22._0_4_) &&
                (auVar37._0_4_ <= (float)local_fc8._0_4_ && auVar19._0_4_ <= local_ff8)) &&
                (local_1018 <= auVar18._0_4_ &&
                (auVar19._0_4_ <= auVar22._0_4_ && local_1008 <= auVar42._0_4_));
        bVar4 = ((auVar15._4_4_ <= (float)local_fd8._4_4_ && fStack_fe4 <= auVar22._4_4_) &&
                (auVar37._4_4_ <= (float)local_fc8._4_4_ && auVar19._4_4_ <= fStack_ff4)) &&
                (fStack_1014 <= auVar18._4_4_ &&
                (auVar19._4_4_ <= auVar22._4_4_ && fStack_1004 <= auVar42._4_4_));
        bVar2 = ((auVar15._8_4_ <= fStack_fd0 && fStack_fe0 <= auVar22._8_4_) &&
                (auVar37._8_4_ <= fStack_fc0 && auVar19._8_4_ <= fStack_ff0)) &&
                (fStack_1010 <= auVar18._8_4_ &&
                (auVar19._8_4_ <= auVar22._8_4_ && fStack_1000 <= auVar42._8_4_));
        bVar5 = ((auVar15._12_4_ <= fStack_fcc && fStack_fdc <= auVar22._12_4_) &&
                (auVar37._12_4_ <= fStack_fbc && auVar19._12_4_ <= fStack_fec)) &&
                (fStack_100c <= auVar18._12_4_ &&
                (auVar19._12_4_ <= auVar22._12_4_ && fStack_ffc <= auVar42._12_4_));
        fVar43 = local_1048;
LAB_0056db23:
        auVar15._0_4_ = (uint)bVar3 * -0x80000000;
        auVar15._4_4_ = (uint)bVar4 * -0x80000000;
        auVar15._8_4_ = (uint)bVar2 * -0x80000000;
        auVar15._12_4_ = (uint)bVar5 * -0x80000000;
        uVar7 = movmskps((int)pauVar8,auVar15);
        if (uVar7 != 0) {
          uVar7 = uVar7 & 0xff;
          uVar11 = (ulong)pauVar10 & 0xfffffffffffffff0;
          lVar12 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          pauVar8 = *(undefined1 (**) [16])(uVar11 + lVar12 * 8);
          uVar7 = uVar7 - 1 & uVar7;
          pauVar10 = pauVar8;
          if (uVar7 != 0) {
            fVar21 = local_1058[lVar12];
            lVar12 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            pauVar10 = *(undefined1 (**) [16])(uVar11 + lVar12 * 8);
            fVar25 = local_1058[lVar12];
            uVar7 = uVar7 - 1 & uVar7;
            if (uVar7 == 0) {
              if ((uint)fVar21 < (uint)fVar25) {
                *(undefined1 (**) [16])*pauVar9 = pauVar10;
                *(float *)((long)*pauVar9 + 8) = fVar25;
                pauVar9 = pauVar9 + 1;
                pauVar10 = pauVar8;
              }
              else {
                *(undefined1 (**) [16])*pauVar9 = pauVar8;
                *(float *)((long)*pauVar9 + 8) = fVar21;
                pauVar8 = pauVar10;
                pauVar9 = pauVar9 + 1;
              }
            }
            else {
              auVar19._8_4_ = fVar21;
              auVar19._0_8_ = pauVar8;
              auVar19._12_4_ = 0;
              auVar18._8_4_ = fVar25;
              auVar18._0_8_ = pauVar10;
              auVar18._12_4_ = 0;
              lVar12 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar1 = *(ulong *)(uVar11 + lVar12 * 8);
              fVar26 = local_1058[lVar12];
              auVar23._8_4_ = fVar26;
              auVar23._0_8_ = uVar1;
              auVar23._12_4_ = 0;
              auVar29._8_4_ = -(uint)((int)fVar21 < (int)fVar25);
              uVar7 = uVar7 - 1 & uVar7;
              if (uVar7 == 0) {
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                auVar15 = auVar19 & auVar29 | ~auVar29 & auVar18;
                auVar19 = auVar18 & auVar29 | ~auVar29 & auVar19;
                auVar30._8_4_ = -(uint)(auVar15._8_4_ < (int)fVar26);
                auVar30._0_8_ = CONCAT44(auVar30._8_4_,auVar30._8_4_);
                auVar30._12_4_ = auVar30._8_4_;
                pauVar8 = (undefined1 (*) [16])
                          (~auVar30._0_8_ & uVar1 | auVar15._0_8_ & auVar30._0_8_);
                auVar15 = auVar23 & auVar30 | ~auVar30 & auVar15;
                auVar16._8_4_ = -(uint)(auVar19._8_4_ < auVar15._8_4_);
                auVar16._4_4_ = auVar16._8_4_;
                auVar16._0_4_ = auVar16._8_4_;
                auVar16._12_4_ = auVar16._8_4_;
                *pauVar9 = ~auVar16 & auVar19 | auVar15 & auVar16;
                pauVar9[1] = auVar19 & auVar16 | ~auVar16 & auVar15;
                pauVar9 = pauVar9 + 2;
                pauVar10 = pauVar8;
              }
              else {
                lVar12 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                fVar43 = local_1058[lVar12];
                auVar36._8_4_ = fVar43;
                auVar36._0_8_ = *(undefined8 *)(uVar11 + lVar12 * 8);
                auVar36._12_4_ = 0;
                auVar31._4_4_ = auVar29._8_4_;
                auVar31._0_4_ = auVar29._8_4_;
                auVar31._8_4_ = auVar29._8_4_;
                auVar31._12_4_ = auVar29._8_4_;
                auVar15 = auVar19 & auVar31 | ~auVar31 & auVar18;
                auVar19 = auVar18 & auVar31 | ~auVar31 & auVar19;
                auVar41._0_4_ = -(uint)((int)fVar26 < (int)fVar43);
                auVar41._4_4_ = -(uint)((int)fVar26 < (int)fVar43);
                auVar41._8_4_ = -(uint)((int)fVar26 < (int)fVar43);
                auVar41._12_4_ = -(uint)((int)fVar26 < (int)fVar43);
                auVar22 = auVar23 & auVar41 | ~auVar41 & auVar36;
                auVar42 = ~auVar41 & auVar23 | auVar36 & auVar41;
                auVar24._8_4_ = -(uint)(auVar19._8_4_ < auVar42._8_4_);
                auVar24._4_4_ = auVar24._8_4_;
                auVar24._0_4_ = auVar24._8_4_;
                auVar24._12_4_ = auVar24._8_4_;
                auVar37 = auVar19 & auVar24 | ~auVar24 & auVar42;
                auVar20._8_4_ = -(uint)(auVar15._8_4_ < auVar22._8_4_);
                auVar20._0_8_ = CONCAT44(auVar20._8_4_,auVar20._8_4_);
                auVar20._12_4_ = auVar20._8_4_;
                pauVar8 = (undefined1 (*) [16])
                          (auVar15._0_8_ & auVar20._0_8_ | ~auVar20._0_8_ & auVar22._0_8_);
                auVar15 = ~auVar20 & auVar15 | auVar22 & auVar20;
                auVar17._8_4_ = -(uint)(auVar15._8_4_ < auVar37._8_4_);
                auVar17._4_4_ = auVar17._8_4_;
                auVar17._0_4_ = auVar17._8_4_;
                auVar17._12_4_ = auVar17._8_4_;
                *pauVar9 = ~auVar24 & auVar19 | auVar42 & auVar24;
                pauVar9[1] = ~auVar17 & auVar15 | auVar37 & auVar17;
                pauVar9[2] = auVar15 & auVar17 | ~auVar17 & auVar37;
                pauVar9 = pauVar9 + 3;
                pauVar10 = pauVar8;
                fVar43 = local_1048;
              }
            }
          }
          goto LAB_0056dab3;
        }
        goto LAB_0056da8e;
      }
      if (((ulong)pauVar10 & 8) == 0) {
        auVar15 = pauVar10[2];
        auVar19 = pauVar10[3];
        auVar22._4_4_ = fVar48;
        auVar22._0_4_ = fVar47;
        auVar22._8_4_ = fVar49;
        auVar22._12_4_ = fVar50;
        auVar22 = maxps(auVar22,auVar15);
        auVar22 = minps(auVar22,auVar19);
        fVar21 = auVar22._0_4_ - fVar47;
        fVar25 = auVar22._4_4_ - fVar48;
        fVar26 = auVar22._8_4_ - fVar49;
        fVar27 = auVar22._12_4_ - fVar50;
        auVar37._4_4_ = fVar52;
        auVar37._0_4_ = fVar51;
        auVar37._8_4_ = fVar53;
        auVar37._12_4_ = fVar54;
        auVar22 = maxps(auVar37,pauVar10[4]);
        auVar22 = minps(auVar22,pauVar10[5]);
        fVar28 = auVar22._0_4_ - fVar51;
        fVar32 = auVar22._4_4_ - fVar52;
        fVar33 = auVar22._8_4_ - fVar53;
        fVar34 = auVar22._12_4_ - fVar54;
        auVar42._4_4_ = fVar56;
        auVar42._0_4_ = fVar55;
        auVar42._8_4_ = fVar57;
        auVar42._12_4_ = fVar58;
        auVar22 = maxps(auVar42,pauVar10[6]);
        auVar22 = minps(auVar22,pauVar10[7]);
        fVar35 = auVar22._0_4_ - fVar55;
        fVar38 = auVar22._4_4_ - fVar56;
        fVar39 = auVar22._8_4_ - fVar57;
        fVar40 = auVar22._12_4_ - fVar58;
        local_1058[0] = fVar35 * fVar35 + fVar28 * fVar28 + fVar21 * fVar21;
        local_1058[1] = fVar38 * fVar38 + fVar32 * fVar32 + fVar25 * fVar25;
        local_1058[2] = fVar39 * fVar39 + fVar33 * fVar33 + fVar26 * fVar26;
        local_1058[3] = fVar40 * fVar40 + fVar34 * fVar34 + fVar27 * fVar27;
        bVar3 = auVar15._0_4_ <= auVar19._0_4_ && local_1058[0] <= fVar59;
        bVar4 = auVar15._4_4_ <= auVar19._4_4_ && local_1058[1] <= fVar60;
        bVar2 = auVar15._8_4_ <= auVar19._8_4_ && local_1058[2] <= fVar61;
        bVar5 = auVar15._12_4_ <= auVar19._12_4_ && local_1058[3] <= fVar62;
        goto LAB_0056db23;
      }
LAB_0056de6b:
      local_1030 = (ulong)((uint)pauVar10 & 0xf) - 8;
      lVar12 = ((ulong)pauVar10 & 0xfffffffffffffff0) + 0x40;
      local_1020 = 0;
      for (local_1028 = 0; local_1028 != local_1030; local_1028 = local_1028 + 1) {
        bVar13 = 0;
        for (lVar14 = 0; (lVar14 != 4 && (*(int *)(lVar12 + lVar14 * 4) != -1)); lVar14 = lVar14 + 1
            ) {
          uVar7 = *(uint *)(lVar12 + -0x10 + lVar14 * 4);
          this = (context->scene->geometries).items[uVar7].ptr;
          context->geomID = uVar7;
          context->primID = *(uint *)(lVar12 + lVar14 * 4);
          bVar5 = Geometry::pointQuery(this,query,context);
          bVar13 = bVar13 | bVar5;
          fVar47 = local_f98;
          fVar48 = fStack_f94;
          fVar49 = fStack_f90;
          fVar50 = fStack_f8c;
          fVar51 = local_fa8;
          fVar52 = fStack_fa4;
          fVar53 = fStack_fa0;
          fVar54 = fStack_f9c;
          fVar55 = local_fb8;
          fVar56 = fStack_fb4;
          fVar57 = fStack_fb0;
          fVar58 = fStack_fac;
          fVar59 = local_f88;
          fVar60 = fStack_f84;
          fVar61 = fStack_f80;
          fVar62 = fStack_f7c;
        }
        local_1020 = CONCAT71((int7)(local_1020 >> 8),(byte)local_1020 | bVar13);
        lVar12 = lVar12 + 0x50;
        fVar43 = local_1048;
      }
    } while ((local_1020 & 1) == 0);
    fVar62 = (context->query_radius).field_0.m128[0];
    fVar59 = (context->query_radius).field_0.m128[1];
    fVar60 = (context->query_radius).field_0.m128[2];
    fStack_1044 = (context->query_radius).field_0.m128[3];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fVar43 = query->radius * query->radius;
      fStack_1040 = 0.0;
      fStack_1044 = 0.0;
    }
    else {
      fStack_1040 = fVar60 * fVar60;
      fStack_1044 = fStack_1044 * fStack_1044;
      fVar43 = fStack_1040 + fVar59 * fVar59 + fVar62 * fVar62;
    }
    bVar6 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }